

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQChar * sq_getlocal(HSQUIRRELVM v,SQUnsignedInteger level,SQUnsignedInteger idx)

{
  ulong uVar1;
  CallInfo *pCVar2;
  SQClosure *pSVar3;
  SQFunctionProto *this;
  SQChar *pSVar4;
  long lVar5;
  SQUnsignedInteger stackbase;
  SQInt32 *pSVar6;
  bool bVar7;
  
  uVar1 = v->_callsstacksize;
  lVar5 = ~level + uVar1;
  if (CARRY8(~level,uVar1)) {
    stackbase = v->_stackbase;
    pCVar2 = v->_callsstack;
    pSVar6 = &pCVar2[uVar1 - 1]._prevstkbase;
    while (bVar7 = level != 0, level = level - 1, bVar7) {
      stackbase = stackbase - (long)*pSVar6;
      pSVar6 = pSVar6 + -0x12;
    }
    if (pCVar2[lVar5]._closure.super_SQObject._type == OT_CLOSURE) {
      pSVar3 = pCVar2[lVar5]._closure.super_SQObject._unVal.pClosure;
      this = pSVar3->_function;
      if ((long)idx < this->_noutervalues) {
        SQVM::Push(v,((pSVar3->_outervalues[idx].super_SQObject._unVal.pArray)->_values)._vals);
        return (SQChar *)&(this->_outervalues[idx]._name.super_SQObject._unVal.pTable)->_firstfree;
      }
      pSVar4 = SQFunctionProto::GetLocal
                         (this,v,stackbase,idx - this->_noutervalues,
                          ((long)pCVar2[lVar5]._ip + (-0xe0 - (long)this) >> 3) - 1);
      return pSVar4;
    }
  }
  return (SQChar *)0x0;
}

Assistant:

const SQChar *sq_getlocal(HSQUIRRELVM v,SQUnsignedInteger level,SQUnsignedInteger idx)
{
    SQUnsignedInteger cstksize=v->_callsstacksize;
    SQUnsignedInteger lvl=(cstksize-level)-1;
    SQInteger stackbase=v->_stackbase;
    if(lvl<cstksize){
        for(SQUnsignedInteger i=0;i<level;i++){
            SQVM::CallInfo &ci=v->_callsstack[(cstksize-i)-1];
            stackbase-=ci._prevstkbase;
        }
        SQVM::CallInfo &ci=v->_callsstack[lvl];
        if(sq_type(ci._closure)!=OT_CLOSURE)
            return NULL;
        SQClosure *c=_closure(ci._closure);
        SQFunctionProto *func=c->_function;
        if(func->_noutervalues > (SQInteger)idx) {
            v->Push(*_outer(c->_outervalues[idx])->_valptr);
            return _stringval(func->_outervalues[idx]._name);
        }
        idx -= func->_noutervalues;
        return func->GetLocal(v,stackbase,idx,(SQInteger)(ci._ip-func->_instructions)-1);
    }
    return NULL;
}